

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  Nf_Mat_t (*paNVar1) [2];
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Nf_Obj_t *pNVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  Mio_Cell2_t *pMVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  ulong uVar20;
  uint uVar21;
  Nf_Mat_t *pNVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  Nf_Obj_t *pBestF [6];
  long alStack_68 [7];
  
  uVar3 = *pCut;
  if (p->vTt2Match->nSize <= (int)(uVar3 >> 6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar17 = uVar3 & 0x1f;
  if (uVar17 != 0) {
    pNVar9 = p->pNfObjs;
    uVar21 = (uVar3 >> 6) << 4;
    pVVar10 = p->vTt2Match->pArray;
    uVar20 = 0;
    do {
      alStack_68[uVar20] = (long)(pNVar9 + pCut[uVar20 + 1]);
      uVar20 = uVar20 + 1;
    } while (uVar17 != uVar20);
    if (uVar17 != 0) {
      if (*(int *)((long)&pVVar10->nSize + (ulong)uVar21) < 2) {
        return;
      }
      if (iObj < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar14 = ((int)pCut - (int)pCutSet & 0xffcU) << 0x12;
      lVar23 = 0;
      do {
        lVar11 = *(long *)((long)&pVVar10->pArray + (ulong)uVar21);
        uVar4 = *(uint *)(lVar11 + 4 + lVar23 * 4);
        uVar18 = (uVar4 ^ uVar3 >> 5) & 1;
        uVar15 = uVar18 | iObj * 2;
        if ((p->vRequired).nSize <= (int)uVar15) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = *(int *)(lVar11 + lVar23 * 4);
        pMVar12 = p->pCells;
        if (uVar17 != *(uint *)&pMVar12[iVar5].field_0x10 >> 0x1c) {
          __assert_fail("nFans == (int)pC->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x472,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
        }
        iVar6 = (p->vRequired).pArray[uVar15];
        puVar19 = (uint *)(&pNVar9[iObj].M[0][0].field_0x0 + (uVar18 << 5));
        fVar25 = pMVar12[iVar5].AreaF;
        bVar16 = 0;
        uVar20 = 0;
        uVar15 = 0;
        do {
          bVar24 = ((uVar4 >> 1 & 0x7f) >> ((uint)uVar20 & 0x1f) & 1) != 0;
          lVar11 = alStack_68[(uVar4 >> 8) >> (bVar16 & 0x1f) & 0xf];
          iVar7 = pMVar12[iVar5].iDelays[uVar20];
          iVar8 = *(int *)(lVar11 + 8 + (ulong)bVar24 * 0x20);
          if ((iVar6 == 0x3fffffff) ||
             (uVar18 = *(int *)(lVar11 + 0x18 + (ulong)bVar24 * 0x20) + iVar7, iVar6 < (int)uVar18))
          {
            if (((int)puVar19[2] < 0x3fffffff) &&
               (((int)puVar19[6] < 0x3fffffff && (iVar6 < iVar7 + iVar8)))) goto LAB_0078751e;
            uVar18 = iVar7 + iVar8;
            if ((int)uVar15 <= (int)uVar18) {
              uVar15 = uVar18;
            }
            if ((1e+32 <= fVar25) ||
               (fVar2 = *(float *)(lVar11 + 0xc + (ulong)bVar24 * 0x20), 1e+32 <= fVar2)) {
              fVar25 = 1e+32;
            }
            else {
              fVar25 = fVar25 + fVar2;
            }
          }
          else {
            if ((int)uVar15 <= (int)uVar18) {
              uVar15 = uVar18;
            }
            fVar25 = fVar25 + *(float *)(lVar11 + 0x1c + (ulong)bVar24 * 0x20);
          }
          uVar20 = uVar20 + 1;
          bVar16 = bVar16 + 4;
        } while (uVar17 != uVar20);
        if ((int)uVar15 < (int)puVar19[2]) {
          puVar19[2] = uVar15;
          puVar19[3] = (uint)fVar25;
          if (pCut <= pCutSet) goto LAB_00787617;
          uVar18 = *puVar19;
          *puVar19 = uVar18 & 0xc00fffff | uVar14;
          *puVar19 = uVar18 & 0xc0000000 | uVar14 | *(uint *)&pMVar12[iVar5].field_0x10 & 0xfffff;
          puVar19[1] = uVar4 & 0xfffffffe;
        }
        if (fVar25 + 0.001 < (float)puVar19[7]) {
          puVar19[6] = uVar15;
          puVar19[7] = (uint)fVar25;
          if (pCut <= pCutSet) goto LAB_00787617;
          uVar15 = puVar19[4];
          puVar19[4] = uVar15 & 0xc00fffff | uVar14;
          puVar19[4] = uVar15 & 0xc0000000 | uVar14 | *(uint *)&pMVar12[iVar5].field_0x10 & 0xfffff;
          puVar19[5] = uVar4 & 0xfffffffe;
        }
LAB_0078751e:
        lVar23 = lVar23 + 2;
        if (*(int *)((long)&pVVar10->nSize + (ulong)uVar21) <= (int)((uint)lVar23 | 1)) {
          return;
        }
      } while( true );
    }
  }
  if (0x3f < uVar3) {
    __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x45a,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
  }
  uVar17 = ((int)pCut - (int)pCutSet & 0xffcU) << 0x12;
  lVar23 = 0;
  bVar24 = true;
  while( true ) {
    pNVar9 = p->pNfObjs;
    uVar21 = (uint)lVar23 ^ (uint)(uVar3 >> 5 == 1);
    pNVar9[iObj].M[lVar23][1].D = 0;
    pNVar9[iObj].M[lVar23][0].D = 0;
    fVar25 = p->pCells[uVar21].AreaF;
    pNVar9[iObj].M[lVar23][1].F = fVar25;
    pNVar9[iObj].M[lVar23][0].F = fVar25;
    if (pCut <= pCutSet) break;
    paNVar1 = pNVar9[iObj].M + lVar23;
    pNVar22 = pNVar9[iObj].M[lVar23] + 1;
    uVar14 = *(uint *)*paNVar1;
    *(uint *)pNVar22 = *(uint *)pNVar22 & 0xc0000000 | uVar17 | uVar21;
    *(uint *)*paNVar1 = uVar14 & 0xc0000000 | uVar17 | uVar21;
    pNVar9[iObj].M[lVar23][1].Cfg = (Nf_Cfg_t)0x0;
    (*paNVar1)[0].Cfg = (Nf_Cfg_t)0x0;
    lVar23 = 1;
    bVar13 = !bVar24;
    bVar24 = false;
    if (bVar13) {
      return;
    }
  }
LAB_00787617:
  __assert_fail("pCut > pCutSet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x93,"int Nf_CutHandle(int *, int *)");
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    int ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->F = pA->F = p->pCells[c ^ Const].AreaF;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        int Required   = Nf_ObjRequired( p, iObj, fCompl ), Delay = 0;
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        float AreaF    = pC->AreaF;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->iDelays[k] <= Required && Required != SCL_INFINITY )
            {
                Delay = Abc_MaxInt( Delay, ArrivalA + pC->iDelays[k] );
                AreaF += pBestF[iFanin]->M[fComplF][1].F;
            }
            else 
            {
                if ( pD->D < SCL_INFINITY && pA->D < SCL_INFINITY && ArrivalD + pC->iDelays[k] > Required )
                    break;
                Delay = Abc_MaxInt( Delay, ArrivalD + pC->iDelays[k] );
                //AreaF += pBestF[iFanin]->M[fComplF][0].F;
                if ( AreaF >= (float)1e32 || pBestF[iFanin]->M[fComplF][0].F >= (float)1e32 )
                    AreaF = (float)1e32;
                else 
                    AreaF += pBestF[iFanin]->M[fComplF][0].F;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->F = AreaF;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->F > AreaF + NF_EPSILON )
        {
            pA->D = Delay;
            pA->F = AreaF;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}